

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_shared_mutex.hpp
# Opt level: O3

void __thiscall
yamc::checked::detail::shared_mutex_base<yamc::rwlock::ReaderPrefer>::unlock_shared
          (shared_mutex_base<yamc::rwlock::ReaderPrefer> *this)

{
  bool bVar1;
  int iVar2;
  pthread_t pVar3;
  __normal_iterator<std::thread::id_*,_std::vector<std::thread::id,_std::allocator<std::thread::id>_>_>
  _Var4;
  id tid;
  id local_28;
  pthread_t local_20;
  
  pVar3 = pthread_self();
  local_28._M_thread = pVar3;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  local_20 = pVar3;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                    ((this->s_owner_).
                     super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->s_owner_).
                     super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var4._M_current !=
      (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    bVar1 = rwlock::ReaderPrefer::release_rlock(&this->state_);
    if (bVar1) {
      std::condition_variable::notify_all();
    }
    _Var4 = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::thread::id*,std::vector<std::thread::id,std::allocator<std::thread::id>>>,__gnu_cxx::__ops::_Iter_equals_val<std::thread::id_const>>
                      ((this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_start,
                       (this->s_owner_).
                       super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
                       .super__Vector_impl_data._M_finish,&local_28);
    if (_Var4._M_current !=
        (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (this->s_owner_).super__Vector_base<std::thread::id,_std::allocator<std::thread::id>_>._M_impl
      .super__Vector_impl_data._M_finish = _Var4._M_current;
    }
    validator::deadlock::unlocked((uintptr_t)this,local_28,true);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return;
  }
  abort();
}

Assistant:

void unlock_shared()
  {
    const auto tid = std::this_thread::get_id();
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (!is_shared_owner(tid)) {
      // owner thread
#if YAMC_CHECKED_CALL_ABORT
      std::abort();
#else
      throw std::system_error(std::make_error_code(std::errc::operation_not_permitted), "invalid unlock_shared");
#endif
    }
    if (RwLockPolicy::release_rlock(state_)) {
      cv_.notify_all();
    }
    auto result = std::remove(s_owner_.begin(), s_owner_.end(), tid);
    s_owner_.erase(result, s_owner_.end());
    validator::unlocked(reinterpret_cast<uintptr_t>(this), tid, true);
  }